

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

char * __thiscall FileReader::GetsFromBuffer(FileReader *this,char *bufptr,char *strbuf,int len)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  
  lVar4 = this->FilePos;
  lVar2 = this->Length - lVar4;
  if (lVar2 < len) {
    len = (int)lVar2;
  }
  pcVar3 = strbuf;
  if (0 < len) {
    while (1 < len) {
      cVar1 = bufptr[lVar4];
      if (cVar1 != '\r') {
        if (cVar1 != '\0') {
          *pcVar3 = cVar1;
          pcVar3 = pcVar3 + 1;
          lVar4 = this->FilePos;
          if (bufptr[lVar4] != '\n') {
            len = len + -1;
            goto LAB_0039e7cd;
          }
        }
        this->FilePos = lVar4 + 1;
        break;
      }
LAB_0039e7cd:
      lVar4 = lVar4 + 1;
      this->FilePos = lVar4;
    }
    if (pcVar3 != strbuf) {
      *pcVar3 = '\0';
      return strbuf;
    }
  }
  return (char *)0x0;
}

Assistant:

char *FileReader::GetsFromBuffer(const char * bufptr, char *strbuf, int len)
{
	if (len>Length-FilePos) len=Length-FilePos;
	if (len <= 0) return NULL;

	char *p = strbuf;
	while (len > 1)
	{
		if (bufptr[FilePos] == 0)
		{
			FilePos++;
			break;
		}
		if (bufptr[FilePos] != '\r')
		{
			*p++ = bufptr[FilePos];
			len--;
			if (bufptr[FilePos] == '\n') 
			{
				FilePos++;
				break;
			}
		}
		FilePos++;
	}
	if (p==strbuf) return NULL;
	*p++=0;
	return strbuf;
}